

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_parse_url_path(connectdata *conn)

{
  int iVar1;
  CURLcode CVar2;
  char local_438 [8];
  char localhost [1025];
  char *local_28;
  char *path;
  smtp_conn *smtpc;
  Curl_easy *data;
  connectdata *conn_local;
  
  local_28 = (conn->data->state).up.path + 1;
  if (*local_28 == '\0') {
    iVar1 = Curl_gethostname(local_438,0x401);
    if (iVar1 == 0) {
      local_28 = local_438;
    }
    else {
      local_28 = "localhost";
    }
  }
  CVar2 = Curl_urldecode(conn->data,local_28,0,&(conn->proto).sshc.readdir_linkPath,(size_t *)0x0,
                         true);
  return CVar2;
}

Assistant:

static CURLcode smtp_parse_url_path(struct connectdata *conn)
{
  /* The SMTP struct is already initialised in smtp_connect() */
  struct Curl_easy *data = conn->data;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  const char *path = &data->state.up.path[1]; /* skip leading path */
  char localhost[HOSTNAME_MAX + 1];

  /* Calculate the path if necessary */
  if(!*path) {
    if(!Curl_gethostname(localhost, sizeof(localhost)))
      path = localhost;
    else
      path = "localhost";
  }

  /* URL decode the path and use it as the domain in our EHLO */
  return Curl_urldecode(conn->data, path, 0, &smtpc->domain, NULL, TRUE);
}